

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  int iVar2;
  FieldDescriptor *this_00;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  EnumDescriptor *pEVar5;
  FieldDescriptor *local_60;
  LogMessage local_58;
  
  this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (this_00 != (FieldDescriptor *)0x0) {
    if (*(once_flag **)(this_00 + 0x30) != (once_flag *)0x0) {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = this_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,
                 &local_60);
    }
    output->type = (FieldType)this_00[0x38];
    output->is_repeated = *(int *)(this_00 + 0x3c) == 3;
    output->is_packed = *(bool *)(*(long *)(this_00 + 0x78) + 0x4c);
    output->descriptor = this_00;
    if (*(once_flag **)(this_00 + 0x30) != (once_flag *)0x0) {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = this_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,
                 &local_60);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this_00 + 0x38) * 4) == 10) {
      pMVar1 = this->factory_;
      pDVar3 = FieldDescriptor::message_type(this_00);
      iVar2 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar3);
      (output->field_3).enum_validity_check.func =
           (EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar2);
      if ((EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar2) == (EnumValidityFuncWithArg *)0x0)
      {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x134);
        pLVar4 = LogMessage::operator<<
                           (&local_58,"CHECK failed: output->message_info.prototype != nullptr: ");
        pLVar4 = LogMessage::operator<<
                           (pLVar4,
                            "Extension factory\'s GetPrototype() returned NULL for extension: ");
        pLVar4 = LogMessage::operator<<(pLVar4,*(string **)(this_00 + 8));
        LogFinisher::operator=((LogFinisher *)&local_60,pLVar4);
        LogMessage::~LogMessage(&local_58);
      }
    }
    else {
      if (*(once_flag **)(this_00 + 0x30) != (once_flag *)0x0) {
        local_58._0_8_ = FieldDescriptor::TypeOnceInit;
        local_60 = this_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,
                   &local_60);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this_00 + 0x38) * 4) == 8)
      {
        (output->field_3).enum_validity_check.func = ValidateEnumUsingDescriptor;
        pEVar5 = FieldDescriptor::enum_type(this_00);
        (output->field_3).enum_validity_check.arg = pEVar5;
      }
    }
  }
  return this_00 != (FieldDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->options().packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      GOOGLE_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned NULL for extension: "
          << extension->full_name();
    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}